

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

wchar_t terminal_set_arrow(EditLine *el,wchar_t *name,keymacro_value_t *fun,wchar_t type)

{
  funckey_t *pfVar1;
  int iVar2;
  long lVar3;
  
  pfVar1 = (el->el_terminal).t_fkey;
  lVar3 = 0x18;
  do {
    iVar2 = wcscmp(name,*(wchar_t **)((long)pfVar1 + lVar3 + -0x18));
    if (iVar2 == 0) {
      *(keymacro_value_t *)((long)pfVar1 + lVar3 + -8) = *fun;
      *(wchar_t *)((long)&pfVar1->name + lVar3) = type;
      return L'\0';
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xf8);
  return L'\xffffffff';
}

Assistant:

libedit_private int
terminal_set_arrow(EditLine *el, const wchar_t *name, keymacro_value_t *fun,
    int type)
{
	funckey_t *arrow = el->el_terminal.t_fkey;
	int i;

	for (i = 0; i < A_K_NKEYS; i++)
		if (wcscmp(name, arrow[i].name) == 0) {
			arrow[i].fun = *fun;
			arrow[i].type = type;
			return 0;
		}
	return -1;
}